

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1906.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *url_after;
  char error_buffer [256];
  undefined8 local_130;
  undefined1 local_128 [256];
  
  uVar3 = curl_url();
  uVar4 = curl_easy_init();
  memset(local_128,0,0x100);
  curl_url_set(uVar3,0,URL,4);
  curl_easy_setopt(uVar4,0x282a,uVar3);
  curl_easy_setopt(uVar4,0x271a,local_128);
  curl_easy_setopt(uVar4,0x29,1);
  curl_easy_setopt(uVar4,3,1);
  iVar2 = curl_easy_perform(uVar4);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    uVar5 = curl_easy_strerror(0);
    curl_mfprintf(uVar1,"failure expected, curl_easy_perform returned %ld: <%s>, <%s>\n",0,uVar5,
                  local_128);
  }
  curl_url_get(uVar3,0,&local_130,0);
  curl_mfprintf(_stderr,"curlu now: <%s>\n",local_130);
  curl_free(local_130);
  curl_easy_setopt(uVar4,3,0);
  iVar2 = curl_easy_perform(uVar4);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar5 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"success expected, curl_easy_perform returned %ld: <%s>, <%s>\n",iVar2,uVar5
                  ,local_128);
  }
  curl_url_get(uVar3,0,&local_130,0);
  curl_mfprintf(_stderr,"curlu now: <%s>\n",local_130);
  curl_free(local_130);
  curl_easy_cleanup(uVar4);
  curl_url_cleanup(uVar3);
  curl_global_cleanup();
  return 0;
}

Assistant:

int test(char *URL)
{
  char *url_after;
  CURLU *curlu = curl_url();
  CURL *curl = curl_easy_init();
  CURLcode curl_code;
  char error_buffer[CURL_ERROR_SIZE] = "";

  curl_url_set(curlu, CURLUPART_URL, URL, CURLU_DEFAULT_SCHEME);
  curl_easy_setopt(curl, CURLOPT_CURLU, curlu);
  curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, error_buffer);
  curl_easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  /* set a port number that makes this reqeuest fail */
  curl_easy_setopt(curl, CURLOPT_PORT, 1L);
  curl_code = curl_easy_perform(curl);
  if(!curl_code)
    fprintf(stderr, "failure expected, "
            "curl_easy_perform returned %ld: <%s>, <%s>\n",
            (long) curl_code, curl_easy_strerror(curl_code), error_buffer);

  /* print the used url */
  curl_url_get(curlu, CURLUPART_URL, &url_after, 0);
  fprintf(stderr, "curlu now: <%s>\n", url_after);
  curl_free(url_after);

  /* now reset CURLOP_PORT to go back to originally set port number */
  curl_easy_setopt(curl, CURLOPT_PORT, 0L);

  curl_code = curl_easy_perform(curl);
  if(curl_code)
    fprintf(stderr, "success expected, "
            "curl_easy_perform returned %ld: <%s>, <%s>\n",
            (long) curl_code, curl_easy_strerror(curl_code), error_buffer);

  /* print url */
  curl_url_get(curlu, CURLUPART_URL, &url_after, 0);
  fprintf(stderr, "curlu now: <%s>\n", url_after);
  curl_free(url_after);

  curl_easy_cleanup(curl);
  curl_url_cleanup(curlu);
  curl_global_cleanup();

  return 0;
}